

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.c
# Opt level: O3

lzma_index * lzma_index_dup(lzma_index *src,lzma_allocator *allocator)

{
  ulong uVar1;
  lzma_vli lVar2;
  lzma_vli lVar3;
  lzma_vli lVar4;
  index_tree_node *piVar5;
  lzma_index *i;
  index_tree_node *piVar6;
  index_tree_node *piVar7;
  index_tree_node *piVar8;
  index_tree_node *piVar9;
  index_tree_node *piVar10;
  lzma_vli lVar11;
  bool bVar12;
  
  i = (lzma_index *)lzma_alloc(0x50,allocator);
  if (i != (lzma_index *)0x0) {
    *(undefined8 *)((long)&(i->streams).leftmost + 4) = 0;
    *(undefined8 *)((long)&(i->streams).rightmost + 4) = 0;
    (i->streams).root = (index_tree_node *)0x0;
    (i->streams).leftmost = (index_tree_node *)0x0;
    i->prealloc = 0x200;
    i->checks = 0;
    lVar11 = src->total_size;
    i->uncompressed_size = src->uncompressed_size;
    i->total_size = lVar11;
    lVar11 = src->index_list_size;
    i->record_count = src->record_count;
    i->index_list_size = lVar11;
    piVar8 = (src->streams).leftmost;
    uVar1 = piVar8[2].compressed_base;
    while (uVar1 < 0xffffffffffffffc) {
      lVar2 = piVar8->uncompressed_base;
      lVar3 = piVar8->compressed_base;
      lVar4 = piVar8[1].uncompressed_base;
      lVar11 = piVar8[1].compressed_base;
      piVar6 = (index_tree_node *)lzma_alloc(0xa8,allocator);
      if (piVar6 == (index_tree_node *)0x0) break;
      piVar6->uncompressed_base = lVar2;
      piVar6->compressed_base = lVar3;
      piVar6->parent = (index_tree_node *)0x0;
      piVar6->left = (index_tree_node *)0x0;
      piVar6->right = (index_tree_node *)0x0;
      *(int *)&piVar6[1].uncompressed_base = (int)lVar4;
      piVar6[1].compressed_base = lVar11;
      piVar6[1].parent = (index_tree_node *)0x0;
      piVar6[1].left = (index_tree_node *)0x0;
      *(undefined8 *)((long)&piVar6[1].left + 4) = 0;
      *(undefined8 *)((long)&piVar6[1].right + 4) = 0;
      lVar11 = piVar8[2].compressed_base;
      piVar6[2].compressed_base = lVar11;
      piVar6[2].parent = piVar8[2].parent;
      piVar7 = piVar8[2].right;
      lVar2 = piVar8[3].uncompressed_base;
      lVar3 = piVar8[3].compressed_base;
      piVar10 = piVar8[3].parent;
      piVar5 = piVar8[3].left;
      piVar6[2].left = piVar8[2].left;
      piVar6[2].right = piVar7;
      piVar6[3].uncompressed_base = lVar2;
      piVar6[3].compressed_base = lVar3;
      piVar6[3].parent = piVar10;
      piVar6[3].left = piVar5;
      piVar6[3].right = piVar8[3].right;
      piVar6[4].uncompressed_base = piVar8[4].uncompressed_base;
      if (piVar8[1].left != (index_tree_node *)0x0) {
        piVar7 = (index_tree_node *)lzma_alloc(lVar11 * 0x10 + 0x40,allocator);
        if (piVar7 != (index_tree_node *)0x0) {
          piVar7->uncompressed_base = 0;
          piVar7->compressed_base = 0;
          piVar7[1].uncompressed_base = 1;
          lVar11 = piVar8[2].compressed_base;
          piVar7[1].compressed_base = lVar11;
          piVar7[1].parent = (index_tree_node *)(lVar11 - 1);
          piVar10 = piVar8[1].left;
          lVar11 = 0;
          do {
            while( true ) {
              memcpy(&piVar7[1].left + lVar11 * 2,&piVar10[1].left,
                     (long)piVar10[1].parent * 0x10 + 0x10);
              lVar11 = (long)&(piVar10[1].parent)->uncompressed_base + lVar11 + 1;
              piVar5 = piVar10->right;
              piVar9 = piVar10;
              if (piVar10->right == (index_tree_node *)0x0) break;
              do {
                piVar10 = piVar5;
                piVar5 = piVar10->left;
              } while (piVar10->left != (index_tree_node *)0x0);
            }
            do {
              piVar10 = piVar9->parent;
              if (piVar10 == (index_tree_node *)0x0) {
                if (lVar11 != piVar7[1].compressed_base) {
                  __assert_fail("i == destg->allocated",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Utilities/cmliblzma/liblzma/common/index.c"
                                ,0x394,
                                "index_stream *index_dup_stream(const index_stream *, const lzma_allocator *)"
                               );
                }
                index_tree_append((index_tree *)&piVar6[1].parent,piVar7);
                goto LAB_0044dbed;
              }
              bVar12 = piVar10->right == piVar9;
              piVar9 = piVar10;
            } while (bVar12);
          } while( true );
        }
        index_stream_end(piVar6,allocator);
        break;
      }
LAB_0044dbed:
      index_tree_append((index_tree *)i,piVar6);
      piVar6 = piVar8->right;
      piVar7 = piVar8;
      if (piVar8->right == (index_tree_node *)0x0) {
        do {
          piVar8 = piVar7->parent;
          if (piVar8 == (index_tree_node *)0x0) {
            return i;
          }
          bVar12 = piVar8->right == piVar7;
          piVar7 = piVar8;
        } while (bVar12);
      }
      else {
        do {
          piVar8 = piVar6;
          piVar6 = piVar8->left;
        } while (piVar8->left != (index_tree_node *)0x0);
      }
      uVar1 = piVar8[2].compressed_base;
    }
    lzma_index_end(i,allocator);
  }
  return (lzma_index *)0x0;
}

Assistant:

extern LZMA_API(lzma_index *)
lzma_index_dup(const lzma_index *src, const lzma_allocator *allocator)
{
	// Allocate the base structure (no initial Stream).
	lzma_index *dest = index_init_plain(allocator);
	if (dest == NULL)
		return NULL;

	// Copy the totals.
	dest->uncompressed_size = src->uncompressed_size;
	dest->total_size = src->total_size;
	dest->record_count = src->record_count;
	dest->index_list_size = src->index_list_size;

	// Copy the Streams and the groups in them.
	const index_stream *srcstream
			= (const index_stream *)(src->streams.leftmost);
	do {
		index_stream *deststream = index_dup_stream(
				srcstream, allocator);
		if (deststream == NULL) {
			lzma_index_end(dest, allocator);
			return NULL;
		}

		index_tree_append(&dest->streams, &deststream->node);

		srcstream = index_tree_next(&srcstream->node);
	} while (srcstream != NULL);

	return dest;
}